

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *__stream;
  bool bVar2;
  dir_tree_t *tree;
  int *piVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char **ppcVar8;
  dir_tree_s *pdVar9;
  file_entry_t *pfVar10;
  long lVar11;
  char *pcVar12;
  char cVar13;
  int iVar14;
  stat zipstat;
  
  uVar6 = 1;
  if (1 < argc) {
    uVar6 = argc;
  }
  bVar1 = false;
  lVar11 = 1;
  iVar5 = 1;
  iVar14 = 0;
LAB_0010470b:
  if (lVar11 < argc) {
    pcVar12 = argv[lVar11];
    if (*pcVar12 != '-') {
      argv[iVar5] = pcVar12;
      iVar5 = iVar5 + 1;
      goto LAB_00104788;
    }
    cVar13 = pcVar12[1];
    if ((cVar13 != '-') || (pcVar12[2] != '\0')) {
      pcVar12 = pcVar12 + 2;
      do {
        if (cVar13 == 'd') {
          DeflateOnly = 1;
        }
        else if (cVar13 == 'f') {
          bVar1 = true;
        }
        else if (cVar13 == 'q') {
          Quiet = 1;
        }
        else {
          if (cVar13 != 'u') goto LAB_00104783;
          iVar14 = 1;
        }
        cVar13 = *pcVar12;
        pcVar12 = pcVar12 + 1;
      } while( true );
    }
    uVar6 = (uint)lVar11;
  }
  ppcVar8 = argv + iVar5;
  for (uVar7 = (ulong)uVar6; (long)uVar7 <= (long)argc; uVar7 = uVar7 + 1) {
    *ppcVar8 = argv[uVar7];
    iVar5 = iVar5 + 1;
    ppcVar8 = ppcVar8 + 1;
  }
  if ((argc - (int)uVar7) + iVar5 < 3) {
LAB_001047d7:
    print_usage(*argv);
    return 1;
  }
  tree = add_dirs(argv + 2);
  if (no_mem == '\x01') {
    free_dir_trees(tree);
    goto LAB_001048c0;
  }
  iVar5 = stat(argv[1],(stat *)&zipstat);
  if (iVar5 == 0) {
    iVar5 = iVar14;
    if (!bVar1) {
      bVar2 = false;
      for (pdVar9 = tree; pdVar9 != (dir_tree_t *)0x0; pdVar9 = pdVar9->next) {
        pfVar10 = (file_entry_t *)&pdVar9->files;
        do {
          pfVar10 = pfVar10->next;
          if (pfVar10 == (file_entry_t *)0x0) goto LAB_001048b3;
        } while (pfVar10->time_write <= zipstat.st_mtim.tv_sec);
        bVar2 = true;
LAB_001048b3:
      }
      goto LAB_0010484c;
    }
LAB_0010485c:
    write_zip(argv[1],tree,iVar5);
  }
  else {
    piVar3 = __errno_location();
    __stream = _stderr;
    iVar5 = 0;
    if (*piVar3 == 2) goto LAB_0010485c;
    pcVar12 = argv[1];
    pcVar4 = strerror(*piVar3);
    fprintf(__stream,"Could not stat %s: %s\n",pcVar12,pcVar4);
    bVar2 = bVar1;
LAB_0010484c:
    iVar5 = iVar14;
    if (bVar1 || bVar2) goto LAB_0010485c;
  }
  free_dir_trees(tree);
  if (no_mem != '\x01') {
    return 0;
  }
LAB_001048c0:
  fwrite("Out of memory.\n",0xf,1,_stderr);
  return 1;
LAB_00104783:
  if (cVar13 != '\0') {
    fprintf(_stderr,"Unknown option \'%c\'\n",(ulong)(uint)(int)cVar13);
    goto LAB_001047d7;
  }
LAB_00104788:
  lVar11 = lVar11 + 1;
  goto LAB_0010470b;
}

Assistant:

int main (int argc, char **argv)
{
	dir_tree_t *tree, *trees;
	file_entry_t *file;
	struct stat zipstat;
	int needwrite;
	int i, j, k;
	int force = 0;
	int update = 0;

	// Find options. Options are removed from the array.
	for (i = k = 1; i < argc; ++i)
	{
		if (argv[i][0] == '-')
		{
			if (argv[i][1] == '-')
			{
				if (argv[i][2] == '\0')
				{ // -- terminates option handling for the rest of the command line
					break;
				}
			}
			for (j = 1; argv[i][j] != '\0'; ++j)
			{
				if (argv[i][j] == 'f')
				{
					force = 1;
				}
				else if (argv[i][j] == 'd')
				{
					DeflateOnly = 1;
				}
				else if (argv[i][j] == 'u')
				{
					update = 1;
				}
				else if (argv[i][j] == 'q')
				{
					Quiet = 1;
				}
				else
				{
					fprintf(stderr, "Unknown option '%c'\n", argv[i][j]);
					print_usage(argv[0]);
					return 1;
				}
			}
		}
		else
		{
			argv[k++] = argv[i];
		}
	}
	for (; i <= argc; ++i)
	{
		argv[k++] = argv[i];
	}
	argc -= i - k;

	if (argc < 3)
	{
		print_usage(argv[0]);
		return 1;
	}

	trees = add_dirs(&argv[2]);
	if (no_mem)
	{
		free_dir_trees(trees);
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}

	needwrite = force;
	if (stat(argv[1], &zipstat) != 0)
	{
		if (errno == ENOENT)
		{
			needwrite = 1;
			update = 0;		// Can't update what's not there.
		}
		else
		{
			fprintf(stderr, "Could not stat %s: %s\n", argv[1], strerror(errno));
		}
	}
	else if (!needwrite)
	{
		// Check the files in each tree. If any one of them was modified more
		// recently than the zip, then it needs to be recreated.
		for (tree = trees; tree != NULL; tree = tree->next)
		{
			for (file = tree->files; file != NULL; file = file->next)
			{
				if (file->time_write > zipstat.st_mtime)
				{
					needwrite = 1;
					break;
				}
			}
		}
	}
	if (force || needwrite)
	{
		write_zip(argv[1], trees, update);
	}
	free_dir_trees(trees);
	if (no_mem)
	{
		fprintf(stderr, "Out of memory.\n");
		return 1;
	}
	return 0;
}